

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bigfile.c
# Opt level: O0

int big_file_open(BigFile *bf,char *basename)

{
  __syscall_slong_t _Var1;
  int iVar2;
  int *piVar3;
  char *pcVar4;
  undefined1 local_b0 [8];
  stat st;
  char *basename_local;
  BigFile *bf_local;
  
  st.__glibc_reserved[2] = (__syscall_slong_t)basename;
  iVar2 = stat(basename,(stat *)local_b0);
  _Var1 = st.__glibc_reserved[2];
  if (iVar2 == 0) {
    pcVar4 = _strdup((char *)st.__glibc_reserved[2]);
    bf->basename = pcVar4;
    bf_local._4_4_ = 0;
  }
  else {
    piVar3 = __errno_location();
    pcVar4 = strerror(*piVar3);
    _big_file_raise("Big File `%s\' does not exist (%s)",
                    "/workspace/llm4binary/github/license_c_cmakelists/rainwoodman[P]bigfile/src/bigfile.c"
                    ,0xbe,_Var1,pcVar4);
    bf_local._4_4_ = -1;
  }
  return bf_local._4_4_;
}

Assistant:

int
big_file_open(BigFile * bf, const char * basename)
{
    struct stat st;
    RAISEIF(0 != stat(basename, &st),
            ex_stat,
            "Big File `%s' does not exist (%s)", basename,
            strerror(errno));
    bf->basename = _strdup(basename);
    return 0;
ex_stat:
    return -1;
}